

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O2

void __thiscall
duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(TProtocol *this)

{
  uint uVar1;
  undefined8 *puVar2;
  
  uVar1 = this->input_recursion_depth_ + 1;
  this->input_recursion_depth_ = uVar1;
  if (uVar1 <= this->recursion_limit_) {
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  puVar2[1] = puVar2 + 3;
  puVar2[2] = 0;
  *(undefined1 *)(puVar2 + 3) = 0;
  *puVar2 = &PTR__TException_004da448;
  *(undefined4 *)(puVar2 + 5) = 6;
  __cxa_throw(puVar2,&TProtocolException::typeinfo,TException::~TException);
}

Assistant:

void incrementInputRecursionDepth() {
    if (recursion_limit_ < ++input_recursion_depth_) {
      throw TProtocolException(TProtocolException::DEPTH_LIMIT);
    }
  }